

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm_x86_fma::forward
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Allocator *pAVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int j;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  int *piVar18;
  void *pvVar19;
  int k;
  Option *pOVar20;
  int max_kk;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  Mat *pMVar25;
  uint uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  uint local_2bc;
  Mat *local_2b8;
  Mat *local_2b0;
  int TILE_N;
  Option *local_2a0;
  ulong local_298;
  int TILE_M;
  int local_288;
  int TILE_K;
  Mat *local_280;
  Option *local_278;
  int local_25c;
  Mat local_258;
  ulong local_210;
  Mat *local_208;
  ulong local_1f0;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  ulong local_f8;
  ulong local_f0;
  Gemm_x86_fma *local_e8;
  Option *local_e0;
  Mat local_d8;
  int TILE_M_2;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  Option *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  int local_50;
  size_t local_48;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar9 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar9;
  }
  iVar9 = (this->super_Gemm).constantA;
  iVar15 = (this->super_Gemm).constantB;
  if (iVar15 != 0 && iVar9 != 0) {
    uVar13 = (this->super_Gemm).constantM;
LAB_004f98b9:
    uVar23 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar9 == 0) {
      iVar21 = (this->super_Gemm).transA;
      if (iVar15 != 0) {
        if (iVar21 == 0) {
          uVar13 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar13 = pMVar1->w;
        }
        goto LAB_004f98b9;
      }
      if (iVar21 == 0) {
        uVar13 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar13 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar23 = pMVar1[1].w;
      }
      else {
        uVar23 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar13 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar23 = pMVar1->w;
      }
      else {
        uVar23 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_258.cstep = 0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258.elemsize._4_4_ = 0;
  local_258.elempack = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  local_e8 = this;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    local_2a0 = opt;
    if (iVar15 != 0 && iVar9 != 0) {
      if (lVar14 == 0x48) {
        local_258.data = pMVar1->data;
        piVar18 = pMVar1->refcount;
        sVar16 = pMVar1->elemsize;
        local_258.elempack = pMVar1->elempack;
        local_278 = (Option *)pMVar1->allocator;
        uVar27._0_4_ = pMVar1->dims;
        uVar27._4_4_ = pMVar1->w;
        uVar31._0_4_ = pMVar1->h;
        uVar31._4_4_ = pMVar1->d;
        local_258.c = pMVar1->c;
        local_258.cstep = pMVar1->cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
      }
      else {
        uVar27 = 0;
        uVar31 = 0;
        local_278 = (Option *)0x0;
        local_258.elempack = 0;
        sVar16 = 0;
        piVar18 = (int *)0x0;
        local_258.data = (void *)0x0;
        local_258.c = 0;
        local_258.cstep = 0;
      }
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_258.refcount._0_4_ = SUB84(piVar18,0);
      local_258.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      local_258.elemsize._0_4_ = (int)sVar16;
      local_258.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
      local_258.allocator = (Allocator *)local_278;
      local_258.dims = (int)uVar27;
      local_258.w = (int)((ulong)uVar27 >> 0x20);
      local_258.h = (int)uVar31;
      local_258.d = (int)((ulong)uVar31 >> 0x20);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_278 == (Option *)0x0) goto LAB_004fbe51;
          (**(code **)(*(long *)local_278 + 0x18))(local_278,local_258.data);
        }
      }
    }
    else if (iVar9 == 0) {
      if (iVar15 == 0) {
        if (lVar14 == 0xd8) {
          local_258.data = pMVar1[2].data;
          piVar18 = pMVar1[2].refcount;
          sVar16 = pMVar1[2].elemsize;
          local_258.elempack = pMVar1[2].elempack;
          local_258.allocator = pMVar1[2].allocator;
          uVar30._0_4_ = pMVar1[2].dims;
          uVar30._4_4_ = pMVar1[2].w;
          uVar34._0_4_ = pMVar1[2].h;
          uVar34._4_4_ = pMVar1[2].d;
          local_258.c = pMVar1[2].c;
          local_258.cstep = pMVar1[2].cstep;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + 1;
            UNLOCK();
          }
        }
        else {
          uVar30 = 0;
          uVar34 = 0;
          local_258.cstep = 0;
          local_258.c = 0;
          local_258.allocator = (Allocator *)0x0;
          local_258.elempack = 0;
          sVar16 = 0;
          piVar18 = (int *)0x0;
          local_258.data = (void *)0x0;
        }
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        local_258.refcount._0_4_ = SUB84(piVar18,0);
        local_258.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
        local_258.elemsize._0_4_ = (int)sVar16;
        local_258.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
        local_258.dims = (int)uVar30;
        local_258.w = (int)((ulong)uVar30 >> 0x20);
        local_258.h = (int)uVar34;
        local_258.d = (int)((ulong)uVar34 >> 0x20);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if ((Option *)local_258.allocator == (Option *)0x0) goto LAB_004fbe51;
            (**(code **)(*(long *)local_258.allocator + 0x18))(local_258.allocator,local_258.data);
          }
        }
      }
      else {
        if (lVar14 == 0x90) {
          local_258.data = pMVar1[1].data;
          piVar18 = pMVar1[1].refcount;
          sVar16 = pMVar1[1].elemsize;
          local_258.elempack = pMVar1[1].elempack;
          local_258.allocator = pMVar1[1].allocator;
          uVar29._0_4_ = pMVar1[1].dims;
          uVar29._4_4_ = pMVar1[1].w;
          uVar33._0_4_ = pMVar1[1].h;
          uVar33._4_4_ = pMVar1[1].d;
          local_258.c = pMVar1[1].c;
          local_258.cstep = pMVar1[1].cstep;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + 1;
            UNLOCK();
          }
        }
        else {
          uVar29 = 0;
          uVar33 = 0;
          local_258.cstep = 0;
          local_258.c = 0;
          local_258.allocator = (Allocator *)0x0;
          local_258.elempack = 0;
          sVar16 = 0;
          piVar18 = (int *)0x0;
          local_258.data = (void *)0x0;
        }
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        local_258.refcount._0_4_ = SUB84(piVar18,0);
        local_258.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
        local_258.elemsize._0_4_ = (int)sVar16;
        local_258.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
        local_258.dims = (int)uVar29;
        local_258.w = (int)((ulong)uVar29 >> 0x20);
        local_258.h = (int)uVar33;
        local_258.d = (int)((ulong)uVar33 >> 0x20);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if ((Option *)local_258.allocator == (Option *)0x0) {
LAB_004fbe51:
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (**(code **)(*(long *)local_258.allocator + 0x18))(local_258.allocator,local_258.data)
              ;
            }
          }
        }
      }
    }
    else {
      if (lVar14 == 0x90) {
        local_258.data = pMVar1[1].data;
        piVar18 = pMVar1[1].refcount;
        sVar16 = pMVar1[1].elemsize;
        local_258.elempack = pMVar1[1].elempack;
        local_258.allocator = pMVar1[1].allocator;
        uVar28._0_4_ = pMVar1[1].dims;
        uVar28._4_4_ = pMVar1[1].w;
        uVar32._0_4_ = pMVar1[1].h;
        uVar32._4_4_ = pMVar1[1].d;
        local_258.c = pMVar1[1].c;
        local_258.cstep = pMVar1[1].cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
      }
      else {
        uVar28 = 0;
        uVar32 = 0;
        local_258.cstep = 0;
        local_258.c = 0;
        local_258.allocator = (Allocator *)0x0;
        local_258.elempack = 0;
        sVar16 = 0;
        piVar18 = (int *)0x0;
        local_258.data = (void *)0x0;
      }
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_258.refcount._0_4_ = SUB84(piVar18,0);
      local_258.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      local_258.elemsize._0_4_ = (int)sVar16;
      local_258.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
      local_258.dims = (int)uVar28;
      local_258.w = (int)((ulong)uVar28 >> 0x20);
      local_258.h = (int)uVar32;
      local_258.d = (int)((ulong)uVar32 >> 0x20);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if ((Option *)local_258.allocator == (Option *)0x0) goto LAB_004fbe51;
          (**(code **)(*(long *)local_258.allocator + 0x18))(local_258.allocator,local_258.data);
        }
      }
    }
    this = local_e8;
    opt = local_2a0;
    local_2bc = 0;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0)) {
      uVar26 = 4;
      if (local_258.elempack * local_258.w != uVar23) {
        uVar26 = (uint)(local_258.elempack * local_258.w == uVar13 && local_258.dims == 1);
      }
      local_2bc = 0;
      if (local_258.dims == 1) {
        local_2bc = uVar26;
      }
      uVar26 = local_258.dims ^ 2;
      if ((local_258.w == 1 && uVar26 == 0) && (local_258.elempack * local_258.h == uVar13)) {
        local_2bc = 2;
      }
      if ((uVar26 == 0 && local_258.w == uVar23) && (local_258.elempack * local_258.h == uVar13)) {
        local_2bc = 3;
      }
      if ((uVar26 == 0 && local_258.w == uVar23) && (local_258.elempack * local_258.h == 1)) {
        local_2bc = 4;
      }
      if ((local_e8->super_Gemm).beta != 1.0) {
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.d = 0;
        local_198.c = 0;
        local_198.w = local_198.refcount._4_4_;
        local_198.h = (int)local_198.elemsize;
        Mat::create_like(&local_198,&local_258,local_2a0->workspace_allocator);
        uVar26 = local_258.c * (int)local_258.cstep * local_258.elempack;
        if (0 < (int)uVar26) {
          uVar17 = 0;
          do {
            *(float *)((long)local_198.data + uVar17 * 4) =
                 (this->super_Gemm).beta * *(float *)((long)local_258.data + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar26 != uVar17);
        }
        piVar18 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + 1;
          UNLOCK();
        }
        piVar18 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if ((Option *)local_258.allocator == (Option *)0x0) {
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (**(code **)(*(long *)local_258.allocator + 0x18))();
            }
          }
        }
        piVar18 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        local_258.data = local_198.data;
        local_258.refcount._0_4_ = local_198.refcount._0_4_;
        local_258.refcount._4_4_ = local_198.refcount._4_4_;
        local_258.elemsize._0_4_ = (int)local_198.elemsize;
        local_258.elemsize._4_4_ = local_198.elemsize._4_4_;
        local_258.elempack = local_198.elempack;
        local_258.allocator = local_198.allocator;
        local_258.dims = local_198.dims;
        local_258.w = local_198.w;
        local_258.h = local_198.h;
        local_258.d = local_198.d;
        local_258.c = local_198.c;
        local_258.cstep = local_198.cstep;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if ((Option *)local_198.allocator == (Option *)0x0) {
              if (local_198.data != (void *)0x0) {
                free(local_198.data);
              }
            }
            else {
              (**(code **)(*(long *)local_198.allocator + 0x18))();
            }
          }
        }
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
      }
    }
  }
  else {
    if (&local_258 != &this->CT_data) {
      piVar18 = (this->CT_data).refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_258.data = (this->CT_data).data;
      piVar18 = (this->CT_data).refcount;
      local_258.refcount._0_4_ = SUB84(piVar18,0);
      local_258.refcount._4_4_ = (uint)((ulong)piVar18 >> 0x20);
      sVar16 = (this->CT_data).elemsize;
      local_258.elemsize._0_4_ = (int)sVar16;
      local_258.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
      local_258.elempack = (this->CT_data).elempack;
      local_258.allocator = (this->CT_data).allocator;
      uVar2 = (this->CT_data).dims;
      uVar3 = (this->CT_data).w;
      uVar4 = (this->CT_data).h;
      uVar5 = (this->CT_data).d;
      local_258.c = (this->CT_data).c;
      local_258.cstep = (this->CT_data).cstep;
      local_258.dims = uVar2;
      local_258.w = uVar3;
      local_258.h = uVar4;
      local_258.d = uVar5;
    }
    local_2bc = (this->super_Gemm).constant_broadcast_type_C;
  }
  local_38 = 1;
  if (opt->use_packing_layout == true) {
    uVar26 = uVar23;
    if ((this->super_Gemm).output_transpose == 0) {
      uVar26 = uVar13;
    }
    local_38 = 8;
    if ((uVar26 & 7) != 0) {
      local_38 = (ulong)((uVar26 & 3) == 0) * 3 + 1;
    }
  }
  uVar26 = (this->super_Gemm).output_elempack;
  if (uVar26 != 0) {
    local_38 = (ulong)uVar26;
  }
  iVar9 = (int)local_38;
  pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar26 = uVar23;
  if ((this->super_Gemm).output_transpose != 0) {
    uVar26 = uVar13;
    uVar13 = uVar23;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(pMVar25,uVar26,(int)uVar13 / iVar9,(ulong)(uint)(iVar9 * 4),iVar9,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar25,uVar26,1,(int)uVar13 / iVar9,(ulong)(uint)(iVar9 * 4),iVar9,
                opt->blob_allocator);
  }
  iVar9 = -100;
  if ((pMVar25->data == (void *)0x0) || ((long)pMVar25->c * pMVar25->cstep == 0)) goto LAB_004fc23d;
  iVar9 = *(int *)&(this->super_Gemm).field_0x244;
  iVar15 = iVar9;
  if (iVar9 == 0) {
    iVar15 = opt->num_threads;
  }
  if (opt->num_threads != iVar9 && iVar9 != 0) {
    forward();
  }
  iVar9 = (this->super_Gemm).constantA;
  iVar21 = (this->super_Gemm).constantB;
  local_208 = pMVar25;
  if (iVar21 == 0 || iVar9 == 0) {
    local_280 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    if (iVar9 == 0) {
      if (iVar21 != 0) {
        iVar9 = (this->super_Gemm).transA;
        local_288 = (this->super_Gemm).constantN;
        iVar21 = (this->super_Gemm).constantK;
        local_1f0 = CONCAT44(local_1f0._4_4_,iVar9);
        if (iVar9 == 0) {
          iVar9 = local_280->elempack * (&local_280->h)[(ulong)(local_280->dims == 3) * 2];
        }
        else {
          iVar9 = local_280->w;
        }
        local_210 = CONCAT44(local_210._4_4_,(this->super_Gemm).output_transpose);
        local_2a0 = opt;
        get_optimal_tile_mnk
                  (iVar9,local_288,iVar21,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                   &TILE_N,&TILE_K,iVar15);
        iVar11 = TILE_K;
        iVar10 = TILE_M;
        local_f0 = CONCAT44(local_f0._4_4_,(iVar9 + TILE_M + -1) / TILE_M);
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
        Mat::create(&local_198,TILE_K * TILE_M,(iVar21 + TILE_K + -1) / TILE_K,iVar15,4,
                    local_2a0->workspace_allocator);
        iVar9 = -100;
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
          if (((int)local_210 == 0) && ((local_2bc != 3 && (iVar21 <= iVar11)))) {
LAB_004fb349:
            if (0 < (int)local_f0) {
              local_298 = CONCAT71(local_298._1_7_,(int)local_210 == 0);
              local_25c = 0;
              pMVar25 = local_208;
              iVar9 = local_288;
              do {
                if ((int)local_1f0 == 0) {
                  iVar15 = local_280->elempack * (&local_280->h)[(ulong)(local_280->dims == 3) * 2];
                  iVar21 = local_280->w;
                }
                else {
                  iVar15 = local_280->w;
                  iVar21 = local_280->elempack * (&local_280->h)[(ulong)(local_280->dims == 3) * 2];
                }
                local_2a0 = (Option *)(ulong)(uint)(TILE_M * local_25c);
                uVar13 = iVar15 - TILE_M * local_25c;
                if (TILE_M < (int)uVar13) {
                  uVar13 = TILE_M;
                }
                local_278 = (Option *)(ulong)uVar13;
                local_148.cstep = 0;
                local_148.data = (void *)0x0;
                local_148.refcount._0_4_ = 0;
                local_148.refcount._4_4_ = 0;
                local_148.elemsize._0_4_ = 0;
                local_148.elemsize._4_4_ = 0;
                local_148.elempack = 0;
                local_148.h = 0;
                local_148.d = 0;
                local_148.c = 0;
                local_148.allocator = (Allocator *)0x0;
                local_148.dims = 0;
                local_148.w = 0;
                if ((((int)local_210 != 0) || (local_2bc == 3)) || (TILE_K < iVar21)) {
                  iVar24 = get_omp_thread_num();
                  iVar11 = local_1e8.d;
                  iVar10 = local_1e8.h;
                  iVar15 = local_1e8.w;
                  iVar9 = local_1e8.dims;
                  uVar7 = local_1e8.elemsize._4_4_;
                  uVar6 = (undefined4)local_1e8.elemsize;
                  uVar17 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                  pvVar19 = (void *)((long)iVar24 * local_1e8.cstep * uVar17 + (long)local_1e8.data)
                  ;
                  uVar17 = (uVar17 * (long)local_1e8.h * (long)local_1e8.w + 0xf &
                           0xfffffffffffffff0) / uVar17;
                  if (local_1e8.dims == 4) {
                    uVar17 = (long)local_1e8.h * (long)local_1e8.w;
                  }
                  piVar18 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  pOVar20 = (Option *)local_1e8.allocator;
                  iVar24 = local_1e8.elempack;
                  if (piVar18 != (int *)0x0) {
                    LOCK();
                    *piVar18 = *piVar18 + -1;
                    UNLOCK();
                    if (*piVar18 == 0) {
                      if ((Option *)local_148.allocator == (Option *)0x0) {
                        if (local_148.data != (void *)0x0) {
                          local_f8 = CONCAT44(local_f8._4_4_,local_1e8.elempack);
                          local_e0 = (Option *)local_1e8.allocator;
                          free(local_148.data);
                          pOVar20 = local_e0;
                          iVar24 = (int)local_f8;
                        }
                      }
                      else {
                        local_f8 = CONCAT44(local_f8._4_4_,local_1e8.elempack);
                        local_e0 = (Option *)local_1e8.allocator;
                        (**(code **)(*(long *)local_148.allocator + 0x18))();
                        pOVar20 = local_e0;
                        iVar24 = (int)local_f8;
                      }
                    }
                  }
                  local_148.dims = iVar9 + -1;
                  local_148.elemsize._0_4_ = uVar6;
                  local_148.elemsize._4_4_ = uVar7;
                  local_148.w = iVar15;
                  local_148.h = iVar10;
                  local_148.d = 1;
                  pMVar25 = local_208;
                  iVar9 = local_288;
                  local_148.data = pvVar19;
                  local_148.elempack = iVar24;
                  local_148.allocator = (Allocator *)pOVar20;
                  local_148.c = iVar11;
                  local_148.cstep = uVar17;
                }
                local_148.refcount._4_4_ = 0;
                local_148.refcount._0_4_ = 0;
                if (0 < iVar9) {
                  iVar15 = 0;
                  do {
                    iVar10 = iVar9 - iVar15;
                    if (TILE_N < iVar9 - iVar15) {
                      iVar10 = TILE_N;
                    }
                    local_2b0 = &local_258;
                    if (local_2bc == 3) {
                      local_2b0 = &local_148;
                      pack_A_tile(&local_258,local_2b0,(int)local_2a0,(int)local_278,iVar15,iVar10);
                    }
                    if (0 < iVar21) {
                      iVar9 = 0;
                      do {
                        iVar24 = TILE_K;
                        iVar11 = iVar21 - iVar9;
                        if (TILE_K < iVar21 - iVar9) {
                          iVar11 = TILE_K;
                        }
                        iVar12 = get_omp_thread_num();
                        local_d8.cstep = (size_t)local_198.w;
                        lVar14 = (long)(iVar9 / iVar24);
                        local_d8.data =
                             (void *)((long)local_198.data +
                                     CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize) *
                                     local_d8.cstep * lVar14 +
                                     (long)iVar12 * local_198.cstep *
                                     CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize));
                        local_d8.refcount._0_4_ = 0;
                        local_d8.refcount._4_4_ = 0;
                        local_d8.elemsize._0_4_ = (int)local_198.elemsize;
                        local_d8.elemsize._4_4_ = local_198.elemsize._4_4_;
                        local_d8.elempack = local_198.elempack;
                        local_d8.allocator = local_198.allocator;
                        local_d8.w = local_198.w;
                        local_d8.dims = 2;
                        local_d8.h = 1;
                        local_d8.d = 1;
                        local_d8.c = 1;
                        local_60._4_4_ = (local_e8->BT_data).w;
                        local_48 = (size_t)local_60._4_4_;
                        sVar16 = (local_e8->BT_data).elemsize;
                        _TILE_M_2 = (void *)((long)(local_e8->BT_data).data +
                                            local_48 * sVar16 * lVar14 +
                                            (long)(iVar15 / TILE_N) * (local_e8->BT_data).cstep *
                                            sVar16);
                        local_70 = (local_e8->BT_data).elempack;
                        local_68 = (Option *)(local_e8->BT_data).allocator;
                        uStack_80 = 0;
                        uStack_7c = 0;
                        local_78 = (undefined4)sVar16;
                        uStack_74 = (undefined4)(sVar16 >> 0x20);
                        local_60._0_4_ = 2;
                        uStack_58._0_4_ = 1;
                        uStack_58._4_4_ = 1;
                        local_50 = 1;
                        if (iVar15 == 0) {
                          if ((int)local_1f0 == 0) {
                            pack_A_tile(local_280,&local_d8,(int)local_2a0,(int)local_278,iVar9,
                                        iVar11);
                          }
                          else {
                            transpose_pack_A_tile
                                      (local_280,&local_d8,(int)local_2a0,(int)local_278,iVar9,
                                       iVar11);
                          }
                        }
                        pMVar25 = local_208;
                        gemm_transB_packed_tile
                                  (&local_d8,(Mat *)&TILE_M_2,local_2b0,&local_148,local_208,
                                   local_2bc,(int)local_2a0,(int)local_278,iVar15,iVar10,iVar9,
                                   iVar11,(bool)(iVar21 <= iVar24 + iVar9 & (byte)local_298));
                        local_48 = 0;
                        _TILE_M_2 = (void *)0x0;
                        uStack_80 = 0;
                        uStack_7c = 0;
                        local_78 = 0;
                        uStack_74 = 0;
                        local_70 = 0;
                        local_60._0_4_ = 0;
                        local_60._4_4_ = 0;
                        uStack_58._0_4_ = 0;
                        uStack_58._4_4_ = 0;
                        local_50 = 0;
                        piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
                        if (piVar18 != (int *)0x0) {
                          LOCK();
                          *piVar18 = *piVar18 + -1;
                          UNLOCK();
                          if (*piVar18 == 0) {
                            if ((Option *)local_d8.allocator == (Option *)0x0) {
                              if (local_d8.data != (void *)0x0) {
                                free(local_d8.data);
                              }
                            }
                            else {
                              (**(code **)(*(long *)local_d8.allocator + 0x18))();
                            }
                          }
                        }
                        local_d8.cstep = 0;
                        local_d8.data = (void *)0x0;
                        local_d8.refcount._0_4_ = 0;
                        local_d8.refcount._4_4_ = 0;
                        local_d8.elemsize._0_4_ = 0;
                        local_d8.elemsize._4_4_ = 0;
                        local_d8.elempack = 0;
                        local_d8.dims = 0;
                        local_d8.w = 0;
                        local_d8.h = 0;
                        local_d8.d = 0;
                        local_d8.c = 0;
                        iVar9 = iVar9 + TILE_K;
                      } while (iVar9 < iVar21);
                    }
                    if ((int)local_210 != 0) {
                      transpose_unpack_output_tile
                                (&local_148,pMVar25,(int)local_2a0,(int)local_278,iVar15,iVar10);
                    }
                    iVar15 = iVar15 + TILE_N;
                    iVar9 = local_288;
                  } while (iVar15 < local_288);
                }
                this = local_e8;
                piVar18 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if ((Option *)local_148.allocator == (Option *)0x0) {
                      if (local_148.data != (void *)0x0) {
                        free(local_148.data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_148.allocator + 0x18))();
                    }
                  }
                }
                local_148.cstep = 0;
                local_148.data = (void *)0x0;
                local_148.refcount._0_4_ = 0;
                local_148.refcount._4_4_ = 0;
                local_148.elemsize._0_4_ = 0;
                local_148.elemsize._4_4_ = 0;
                local_148.elempack = 0;
                local_148.dims = 0;
                local_148.w = 0;
                local_148.h = 0;
                local_148.d = 0;
                local_148.c = 0;
                local_25c = local_25c + 1;
              } while (local_25c != (int)local_f0);
            }
            iVar9 = 0;
          }
          else {
            Mat::create(&local_1e8,iVar10 * TILE_N,1,iVar15,4,local_2a0->workspace_allocator);
            iVar9 = -100;
            if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0))
            goto LAB_004fb349;
          }
          piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if ((Option *)local_1e8.allocator == (Option *)0x0) {
                if (local_1e8.data != (void *)0x0) {
                  free(local_1e8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_1e8.allocator + 0x18))();
              }
            }
          }
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
        }
        pMVar25 = local_208;
        piVar18 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 != 0) goto LAB_004fc203;
          if ((Option *)local_198.allocator != (Option *)0x0) {
            (**(code **)(*(long *)local_198.allocator + 0x18))();
            goto LAB_004fc203;
          }
          if (local_198.data == (void *)0x0) goto LAB_004fc203;
LAB_004fb03d:
          free(local_198.data);
        }
        goto LAB_004fc203;
      }
      local_2a0 = opt;
      iVar9 = gemm_x86(local_280,local_280 + 1,&local_258,pMVar25,local_2bc,
                       (this->super_Gemm).transA,(this->super_Gemm).transB,
                       (this->super_Gemm).output_transpose,(this->super_Gemm).constant_TILE_M,
                       (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,iVar15,
                       opt);
    }
    else {
      iVar9 = (this->super_Gemm).transB;
      uVar13 = (this->super_Gemm).constantM;
      uVar17 = (ulong)uVar13;
      uVar23 = (this->super_Gemm).constantK;
      local_1f0 = (ulong)uVar23;
      local_278 = (Option *)CONCAT44(local_278._4_4_,iVar9);
      if (iVar9 == 0) {
        uVar26 = local_280->w;
      }
      else {
        uVar26 = local_280->elempack * (&local_280->h)[(ulong)(local_280->dims == 3) * 2];
      }
      local_288 = (this->super_Gemm).output_transpose;
      get_optimal_tile_mnk
                (uVar13,uVar26,uVar23,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar15);
      local_f0 = CONCAT44(local_f0._4_4_,(int)(uVar13 + TILE_M + -1) / TILE_M);
      iVar24 = (int)(TILE_N + uVar26 + -1) / TILE_N;
      iVar11 = (int)(uVar23 + TILE_K + -1) / TILE_K;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,TILE_K * TILE_N,iVar11,iVar24,4,opt->workspace_allocator);
      iVar10 = TILE_K;
      iVar21 = TILE_N;
      iVar9 = -100;
      local_f8 = uVar17;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        iVar24 = iVar24 * iVar11;
        local_2a0 = opt;
        local_210 = (ulong)uVar26;
        if (0 < iVar24) {
          iVar9 = 0;
          do {
            j = iVar21 * (iVar9 / iVar11);
            k = iVar10 * (int)((long)iVar9 % (long)iVar11);
            iVar12 = (int)local_210 - j;
            if (iVar21 < iVar12) {
              iVar12 = iVar21;
            }
            max_kk = (int)local_1f0 - k;
            if (iVar10 < max_kk) {
              max_kk = iVar10;
            }
            local_1e8.cstep = (size_t)local_198.w;
            local_1e8.data =
                 (void *)((long)local_198.data +
                         ((long)iVar9 % (long)iVar11 & 0xffffffffU) * local_1e8.cstep *
                         CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize) +
                         (long)(iVar9 / iVar11) * local_198.cstep *
                         CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize));
            local_1e8.refcount._0_4_ = 0;
            local_1e8.refcount._4_4_ = 0;
            local_1e8.elemsize._0_4_ = (int)local_198.elemsize;
            local_1e8.elemsize._4_4_ = local_198.elemsize._4_4_;
            local_1e8.elempack = local_198.elempack;
            local_1e8.allocator = local_198.allocator;
            local_1e8.dims = 2;
            local_1e8.w = local_198.w;
            local_1e8.h = 1;
            local_1e8.d = 1;
            local_1e8.c = 1;
            if ((int)local_278 == 0) {
              transpose_pack_B_tile(local_280,&local_1e8,j,iVar12,k,max_kk);
            }
            else {
              pack_B_tile(local_280,&local_1e8,j,iVar12,k,max_kk);
            }
            iVar9 = iVar9 + 1;
          } while (iVar24 != iVar9);
        }
        uVar17 = local_210;
        local_1e8.cstep = 0;
        local_1e8.data = (void *)0x0;
        local_1e8.refcount._0_4_ = 0;
        local_1e8.refcount._4_4_ = 0;
        local_1e8.elemsize._0_4_ = 0;
        local_1e8.elemsize._4_4_ = 0;
        local_1e8.elempack = 0;
        local_1e8.allocator = (Allocator *)0x0;
        local_1e8.dims = 0;
        local_1e8.w = 0;
        local_1e8.h = 0;
        local_1e8.d = 0;
        local_1e8.c = 0;
        if (((local_288 == 0) && (local_2bc != 3)) && ((int)local_1f0 <= TILE_K)) {
LAB_004fa8e8:
          if (0 < (int)local_f0) {
            local_280 = (Mat *)CONCAT71(local_280._1_7_,local_288 == 0);
            iVar9 = 0;
            do {
              iVar15 = TILE_M * iVar9;
              uVar13 = (int)local_f8 - iVar15;
              if (TILE_M < (int)uVar13) {
                uVar13 = TILE_M;
              }
              local_298 = (ulong)uVar13;
              local_148.cstep = 0;
              local_148.data = (void *)0x0;
              local_148.refcount._0_4_ = 0;
              local_148.refcount._4_4_ = 0;
              local_148.elemsize._0_4_ = 0;
              local_148.elemsize._4_4_ = 0;
              local_148.elempack = 0;
              local_148.h = 0;
              local_148.d = 0;
              local_148.c = 0;
              local_148.allocator = (Allocator *)0x0;
              local_148.dims = 0;
              local_148.w = 0;
              local_25c = iVar9;
              if (((local_288 != 0) || (local_2bc == 3)) || (TILE_K < (int)local_1f0)) {
                iVar11 = get_omp_thread_num();
                iVar10 = local_1e8.d;
                iVar21 = local_1e8.w;
                iVar9 = local_1e8.dims;
                pAVar8 = local_1e8.allocator;
                uVar7 = local_1e8.elemsize._4_4_;
                uVar6 = (undefined4)local_1e8.elemsize;
                pOVar20 = (Option *)(long)local_1e8.h;
                uVar17 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                pvVar19 = (void *)((long)iVar11 * local_1e8.cstep * uVar17 + (long)local_1e8.data);
                uVar22 = (uVar17 * (long)pOVar20 * (long)local_1e8.w + 0xf & 0xfffffffffffffff0) /
                         uVar17;
                if (local_1e8.dims == 4) {
                  uVar22 = (long)pOVar20 * (long)local_1e8.w;
                }
                piVar18 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                iVar11 = local_1e8.h;
                iVar24 = local_1e8.elempack;
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if ((Option *)local_148.allocator == (Option *)0x0) {
                      if (local_148.data != (void *)0x0) {
                        local_2a0 = (Option *)CONCAT44(local_2a0._4_4_,local_1e8.elempack);
                        local_278 = pOVar20;
                        free(local_148.data);
                        iVar11 = (int)local_278;
                        iVar24 = (int)local_2a0;
                      }
                    }
                    else {
                      local_2a0 = (Option *)CONCAT44(local_2a0._4_4_,local_1e8.elempack);
                      local_278 = pOVar20;
                      (**(code **)(*(long *)local_148.allocator + 0x18))();
                      iVar11 = (int)local_278;
                      iVar24 = (int)local_2a0;
                    }
                  }
                }
                local_148.dims = iVar9 + -1;
                local_148.elemsize._0_4_ = uVar6;
                local_148.elemsize._4_4_ = uVar7;
                local_148.allocator = pAVar8;
                local_148.w = iVar21;
                local_148.d = 1;
                local_148.c = iVar10;
                uVar17 = local_210;
                local_148.data = pvVar19;
                local_148.elempack = iVar24;
                local_148.h = iVar11;
                local_148.cstep = uVar22;
              }
              local_148.refcount._4_4_ = 0;
              local_148.refcount._0_4_ = 0;
              if (0 < (int)uVar17) {
                pOVar20 = (Option *)0x0;
                uVar22 = local_1f0;
                do {
                  uVar13 = (int)uVar17 - (int)pOVar20;
                  if (TILE_N < (int)uVar13) {
                    uVar13 = TILE_N;
                  }
                  local_278 = (Option *)(ulong)uVar13;
                  local_2b8 = &local_258;
                  if (local_2bc == 3) {
                    local_2b8 = &local_148;
                    pack_A_tile(&local_258,local_2b8,iVar15,(int)local_298,(int)pOVar20,uVar13);
                  }
                  local_2a0 = pOVar20;
                  if (0 < (int)uVar22) {
                    iVar9 = 0;
                    uVar17 = uVar22;
                    do {
                      uVar22 = local_1f0;
                      iVar21 = (int)uVar17 - iVar9;
                      if (TILE_K < iVar21) {
                        iVar21 = TILE_K;
                      }
                      sVar16 = (local_e8->AT_data).elemsize;
                      local_d8.w = (local_e8->AT_data).w;
                      local_d8.cstep = (size_t)local_d8.w;
                      local_d8.elempack = (local_e8->AT_data).elempack;
                      local_d8.allocator = (local_e8->AT_data).allocator;
                      local_d8.data =
                           (void *)((long)(local_e8->AT_data).data +
                                   sVar16 * local_d8.cstep * (long)(iVar9 / TILE_K) +
                                   (long)(iVar15 / TILE_M) * (local_e8->AT_data).cstep * sVar16);
                      local_d8.refcount._0_4_ = 0;
                      local_d8.refcount._4_4_ = 0;
                      local_d8.elemsize._0_4_ = (undefined4)sVar16;
                      local_d8.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
                      local_d8.dims = 2;
                      local_d8.h = 1;
                      local_d8.d = 1;
                      local_d8.c = 1;
                      local_48 = (size_t)local_198.w;
                      _TILE_M_2 = (void *)((long)local_198.data +
                                          local_48 *
                                          CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize)
                                          * (long)(iVar9 / TILE_K) +
                                          (long)(int)((long)((ulong)(uint)((int)local_2a0 >> 0x1f)
                                                             << 0x20 | (ulong)local_2a0 & 0xffffffff
                                                            ) / (long)TILE_N) * local_198.cstep *
                                          CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize)
                                          );
                      uStack_80 = 0;
                      uStack_7c = 0;
                      local_78 = (int)local_198.elemsize;
                      uStack_74 = local_198.elemsize._4_4_;
                      local_70 = local_198.elempack;
                      local_68 = (Option *)local_198.allocator;
                      local_60._4_4_ = local_198.w;
                      local_60._0_4_ = 2;
                      uStack_58._0_4_ = 1;
                      uStack_58._4_4_ = 1;
                      local_50 = 1;
                      iVar10 = (int)local_1f0;
                      gemm_transB_packed_tile
                                (&local_d8,(Mat *)&TILE_M_2,local_2b8,&local_148,local_208,local_2bc
                                 ,iVar15,(int)local_298,(int)local_2a0,(int)local_278,iVar9,iVar21,
                                 (bool)(iVar10 <= TILE_K + iVar9 & (byte)local_280));
                      local_48 = 0;
                      _TILE_M_2 = (void *)0x0;
                      uStack_80 = 0;
                      uStack_7c = 0;
                      local_78 = 0;
                      uStack_74 = 0;
                      local_70 = 0;
                      local_60._0_4_ = 0;
                      local_60._4_4_ = 0;
                      uStack_58._0_4_ = 0;
                      uStack_58._4_4_ = 0;
                      local_50 = 0;
                      piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
                      if (piVar18 != (int *)0x0) {
                        LOCK();
                        *piVar18 = *piVar18 + -1;
                        UNLOCK();
                        if (*piVar18 == 0) {
                          if ((Option *)local_d8.allocator == (Option *)0x0) {
                            if (local_d8.data != (void *)0x0) {
                              free(local_d8.data);
                            }
                          }
                          else {
                            (**(code **)(*(long *)local_d8.allocator + 0x18))();
                          }
                        }
                      }
                      local_d8.cstep = 0;
                      local_d8.data = (void *)0x0;
                      local_d8.refcount._0_4_ = 0;
                      local_d8.refcount._4_4_ = 0;
                      local_d8.elemsize._0_4_ = 0;
                      local_d8.elemsize._4_4_ = 0;
                      local_d8.elempack = 0;
                      local_d8.dims = 0;
                      local_d8.w = 0;
                      local_d8.h = 0;
                      local_d8.d = 0;
                      local_d8.c = 0;
                      iVar9 = iVar9 + TILE_K;
                      uVar17 = uVar22;
                    } while (iVar9 < iVar10);
                  }
                  iVar9 = (int)local_2a0;
                  if (local_288 != 0) {
                    transpose_unpack_output_tile
                              (&local_148,local_208,iVar15,(int)local_298,iVar9,(int)local_278);
                  }
                  uVar13 = iVar9 + TILE_N;
                  pOVar20 = (Option *)(ulong)uVar13;
                  uVar17 = local_210;
                } while ((int)uVar13 < (int)local_210);
              }
              iVar9 = local_25c;
              piVar18 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
              if (piVar18 != (int *)0x0) {
                LOCK();
                *piVar18 = *piVar18 + -1;
                UNLOCK();
                if (*piVar18 == 0) {
                  if ((Option *)local_148.allocator == (Option *)0x0) {
                    if (local_148.data != (void *)0x0) {
                      free(local_148.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_148.allocator + 0x18))();
                  }
                }
              }
              local_148.cstep = 0;
              local_148.data = (void *)0x0;
              local_148.refcount._0_4_ = 0;
              local_148.refcount._4_4_ = 0;
              local_148.elemsize._0_4_ = 0;
              local_148.elemsize._4_4_ = 0;
              local_148.elempack = 0;
              local_148.dims = 0;
              local_148.w = 0;
              local_148.h = 0;
              local_148.d = 0;
              local_148.c = 0;
              iVar9 = iVar9 + 1;
            } while (iVar9 != (int)local_f0);
          }
          iVar9 = 0;
        }
        else {
          Mat::create(&local_1e8,TILE_M * TILE_N,1,iVar15,4,local_2a0->workspace_allocator);
          iVar9 = -100;
          if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0))
          goto LAB_004fa8e8;
        }
        piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if ((Option *)local_1e8.allocator == (Option *)0x0) {
              if (local_1e8.data != (void *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_1e8.allocator + 0x18))();
            }
          }
        }
        local_1e8.cstep = 0;
        local_1e8.data = (void *)0x0;
        local_1e8.refcount._0_4_ = 0;
        local_1e8.refcount._4_4_ = 0;
        local_1e8.elemsize._0_4_ = 0;
        local_1e8.elemsize._4_4_ = 0;
        local_1e8.elempack = 0;
        local_1e8.dims = 0;
        local_1e8.w = 0;
        local_1e8.h = 0;
        local_1e8.d = 0;
        local_1e8.c = 0;
      }
      this = local_e8;
      pMVar25 = local_208;
      piVar18 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if ((Option *)local_198.allocator == (Option *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (**(code **)(*(long *)local_198.allocator + 0x18))();
          }
        }
      }
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
    }
  }
  else {
    uVar13 = (this->super_Gemm).constantM;
    iVar9 = (this->super_Gemm).constantN;
    iVar21 = (this->super_Gemm).constantK;
    local_280 = (Mat *)CONCAT44(local_280._4_4_,(this->super_Gemm).output_transpose);
    local_210 = CONCAT44(local_210._4_4_,iVar9);
    get_optimal_tile_mnk
              (uVar13,iVar9,iVar21,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M_2,
               &TILE_M,&TILE_N,iVar15);
    local_25c = (int)(uVar13 + TILE_M_2 + -1) / TILE_M_2;
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    local_f0 = (ulong)uVar13;
    if ((((int)local_280 == 0) && (local_2bc != 3)) && (iVar21 <= TILE_N)) {
LAB_004f9eeb:
      if (0 < local_25c) {
        local_1f0 = CONCAT71(local_1f0._1_7_,(int)local_280 == 0);
        iVar10 = 0;
        uVar17 = local_f0;
        iVar15 = (int)local_280;
        iVar9 = (int)local_210;
        do {
          local_278 = (Option *)(ulong)(uint)(TILE_M_2 * iVar10);
          uVar13 = (int)uVar17 - TILE_M_2 * iVar10;
          if (TILE_M_2 < (int)uVar13) {
            uVar13 = TILE_M_2;
          }
          local_298 = (ulong)uVar13;
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_288 = iVar10;
          if (((iVar15 != 0) || (local_2bc == 3)) || (TILE_N < iVar21)) {
            iVar11 = get_omp_thread_num();
            iVar10 = local_198.d;
            iVar15 = local_198.w;
            iVar9 = local_198.dims;
            uVar7 = local_198.elemsize._4_4_;
            uVar6 = (int)local_198.elemsize;
            uVar22 = (ulong)local_198.h;
            uVar17 = CONCAT44(local_198.elemsize._4_4_,(int)local_198.elemsize);
            pvVar19 = (void *)((long)iVar11 * local_198.cstep * uVar17 + (long)local_198.data);
            uVar17 = (uVar17 * uVar22 * (long)local_198.w + 0xf & 0xfffffffffffffff0) / uVar17;
            if (local_198.dims == 4) {
              uVar17 = uVar22 * (long)local_198.w;
            }
            piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
            pOVar20 = (Option *)local_198.allocator;
            iVar11 = local_198.elempack;
            iVar24 = local_198.h;
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                local_2a0 = (Option *)local_198.allocator;
                if ((Option *)local_1e8.allocator == (Option *)0x0) {
                  if (local_1e8.data != (void *)0x0) {
                    local_e0 = (Option *)CONCAT44(local_e0._4_4_,local_198.elempack);
                    local_f8 = uVar22;
                    free(local_1e8.data);
                    iVar24 = (int)local_f8;
                    pOVar20 = local_2a0;
                    iVar11 = (int)local_e0;
                  }
                }
                else {
                  local_e0 = (Option *)CONCAT44(local_e0._4_4_,local_198.elempack);
                  local_f8 = uVar22;
                  (**(code **)(*(long *)local_1e8.allocator + 0x18))();
                  pOVar20 = local_2a0;
                  iVar11 = (int)local_e0;
                  iVar24 = (int)local_f8;
                }
              }
            }
            local_1e8.dims = iVar9 + -1;
            local_1e8.elemsize._0_4_ = uVar6;
            local_1e8.elemsize._4_4_ = uVar7;
            local_1e8.w = iVar15;
            local_1e8.d = 1;
            pMVar25 = local_208;
            iVar9 = (int)local_210;
            local_1e8.data = pvVar19;
            local_1e8.elempack = iVar11;
            local_1e8.allocator = (Allocator *)pOVar20;
            local_1e8.h = iVar24;
            local_1e8.c = iVar10;
            local_1e8.cstep = uVar17;
          }
          local_1e8.refcount._4_4_ = 0;
          local_1e8.refcount._0_4_ = 0;
          if (0 < iVar9) {
            pOVar20 = (Option *)0x0;
            do {
              iVar9 = iVar9 - (int)pOVar20;
              if (TILE_M < iVar9) {
                iVar9 = TILE_M;
              }
              local_2b0 = &local_258;
              local_2a0 = pOVar20;
              if (local_2bc == 3) {
                local_2b0 = &local_1e8;
                pack_A_tile(&local_258,local_2b0,(int)local_278,(int)local_298,(int)pOVar20,iVar9);
              }
              if (0 < iVar21) {
                iVar15 = 0;
                do {
                  pMVar25 = local_208;
                  iVar10 = iVar21 - iVar15;
                  if (TILE_N < iVar21 - iVar15) {
                    iVar10 = TILE_N;
                  }
                  sVar16 = (local_e8->AT_data).elemsize;
                  local_148.w = (local_e8->AT_data).w;
                  local_148.cstep = (size_t)local_148.w;
                  local_148.elempack = (local_e8->AT_data).elempack;
                  local_148.allocator = (local_e8->AT_data).allocator;
                  local_148.data =
                       (void *)((long)(local_e8->AT_data).data +
                               sVar16 * local_148.cstep * (long)(iVar15 / TILE_N) +
                               (long)(int)((long)((ulong)(uint)((int)local_278 >> 0x1f) << 0x20 |
                                                 (ulong)local_278 & 0xffffffff) / (long)TILE_M_2) *
                               (local_e8->AT_data).cstep * sVar16);
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.elemsize._0_4_ = (undefined4)sVar16;
                  local_148.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
                  local_148.dims = 2;
                  local_148.h = 1;
                  local_148.d = 1;
                  local_148.c = 1;
                  local_d8.w = (local_e8->BT_data).w;
                  local_d8.cstep = (size_t)local_d8.w;
                  sVar16 = (local_e8->BT_data).elemsize;
                  local_d8.elempack = (local_e8->BT_data).elempack;
                  local_d8.data =
                       (void *)((long)(local_e8->BT_data).data +
                               local_d8.cstep * sVar16 * (long)(iVar15 / TILE_N) +
                               (long)(int)((long)((ulong)(uint)((int)local_2a0 >> 0x1f) << 0x20 |
                                                 (ulong)local_2a0 & 0xffffffff) / (long)TILE_M) *
                               (local_e8->BT_data).cstep * sVar16);
                  local_d8.allocator = (local_e8->BT_data).allocator;
                  local_d8.refcount._0_4_ = 0;
                  local_d8.refcount._4_4_ = 0;
                  local_d8.elemsize._0_4_ = (undefined4)sVar16;
                  local_d8.elemsize._4_4_ = (undefined4)(sVar16 >> 0x20);
                  local_d8.dims = 2;
                  local_d8.h = 1;
                  local_d8.d = 1;
                  local_d8.c = 1;
                  gemm_transB_packed_tile
                            (&local_148,&local_d8,local_2b0,&local_1e8,local_208,local_2bc,
                             (int)local_278,(int)local_298,(int)local_2a0,iVar9,iVar15,iVar10,
                             (bool)(iVar21 <= TILE_N + iVar15 & (byte)local_1f0));
                  local_d8.cstep = 0;
                  local_d8.data = (void *)0x0;
                  local_d8.refcount._0_4_ = 0;
                  local_d8.refcount._4_4_ = 0;
                  local_d8.elemsize._0_4_ = 0;
                  local_d8.elemsize._4_4_ = 0;
                  local_d8.elempack = 0;
                  local_d8.dims = 0;
                  local_d8.w = 0;
                  local_d8.h = 0;
                  local_d8.d = 0;
                  local_d8.c = 0;
                  piVar18 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  if (piVar18 != (int *)0x0) {
                    LOCK();
                    *piVar18 = *piVar18 + -1;
                    UNLOCK();
                    if (*piVar18 == 0) {
                      if ((Option *)local_148.allocator == (Option *)0x0) {
                        if (local_148.data != (void *)0x0) {
                          free(local_148.data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_148.allocator + 0x18))();
                      }
                    }
                  }
                  local_148.cstep = 0;
                  local_148.data = (void *)0x0;
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.elemsize._0_4_ = 0;
                  local_148.elemsize._4_4_ = 0;
                  local_148.elempack = 0;
                  local_148.dims = 0;
                  local_148.w = 0;
                  local_148.h = 0;
                  local_148.d = 0;
                  local_148.c = 0;
                  iVar15 = iVar15 + TILE_N;
                } while (iVar15 < iVar21);
              }
              iVar15 = (int)local_2a0;
              if ((int)local_280 != 0) {
                transpose_unpack_output_tile
                          (&local_1e8,pMVar25,(int)local_278,(int)local_298,iVar15,iVar9);
              }
              uVar13 = iVar15 + TILE_M;
              pOVar20 = (Option *)(ulong)uVar13;
              iVar9 = (int)local_210;
            } while ((int)uVar13 < (int)local_210);
          }
          this = local_e8;
          uVar17 = local_f0;
          piVar18 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
          iVar15 = (int)local_280;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if ((Option *)local_1e8.allocator == (Option *)0x0) {
                if (local_1e8.data != (void *)0x0) {
                  free(local_1e8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_1e8.allocator + 0x18))();
              }
            }
          }
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
          iVar10 = local_288 + 1;
        } while (iVar10 != local_25c);
      }
      iVar9 = 0;
    }
    else {
      Mat::create(&local_198,TILE_M_2 * TILE_M,1,iVar15,4,opt->workspace_allocator);
      iVar9 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0))
      goto LAB_004f9eeb;
    }
    piVar18 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if ((Option *)local_198.allocator == (Option *)0x0) {
          if (local_198.data != (void *)0x0) goto LAB_004fb03d;
        }
        else {
          (**(code **)(*(long *)local_198.allocator + 0x18))();
        }
      }
    }
LAB_004fc203:
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
  }
  if (iVar9 == 0) {
    iVar9 = 0;
    if (((this->super_Gemm).alpha != 1.0) &&
       (uVar13 = (int)local_38 * (int)pMVar25->cstep * pMVar25->c, iVar9 = 0, 0 < (int)uVar13)) {
      pvVar19 = pMVar25->data;
      iVar9 = 0;
      uVar17 = 0;
      do {
        *(float *)((long)pvVar19 + uVar17 * 4) =
             *(float *)((long)pvVar19 + uVar17 * 4) * (this->super_Gemm).alpha;
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
  }
LAB_004fc23d:
  piVar18 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Option *)local_258.allocator == (Option *)0x0) {
        if (local_258.data != (void *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (**(code **)(*(long *)local_258.allocator + 0x18))();
      }
    }
  }
  return iVar9;
}

Assistant:

int Gemm_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        // return Gemm::forward_int8(bottom_blobs, top_blobs, opt);
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    if (ret != 0)
        return ret;

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return 0;
}